

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  const_iterator cVar2;
  bool bVar3;
  int iVar4;
  int i;
  int index;
  char *pcVar5;
  SetKey *pSVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  stringstream string_buffer;
  TransparentHasher local_368;
  undefined1 local_358 [8];
  undefined8 local_350;
  AssertHelper local_348;
  SetKey local_339;
  const_iterator local_338;
  value_type *local_2f0;
  undefined1 local_2e8 [16];
  char local_2d8 [16];
  ulong local_2c8;
  float local_2c0;
  float local_2bc;
  undefined1 local_2b8;
  undefined8 local_2a0;
  sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>> local_298 [56]
  ;
  ulong local_260;
  undefined **local_250;
  undefined1 local_248 [144];
  pair<google::sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_1b8;
  ios_base local_138 [264];
  
  local_2e8._0_8_ = (char *)0x0;
  local_2e8._8_4_ = 0;
  local_338.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_338.pos.row_begin._M_current = local_338.pos.row_begin._M_current & 0xffffffff00000000;
  local_1b8.first.ht._0_4_ = 0;
  local_1b8.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_250 = &PTR__BaseHashtableInterface_00c23ca8;
  pSVar6 = (SetKey *)&local_368;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_248,0,(TransparentHasher *)local_2e8,(TransparentHasher *)&local_338,
                     (Identity *)local_358,pSVar6,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1b8);
  local_250 = &PTR__BaseHashtableInterface_00c23c28;
  iVar4 = UniqueObjectHelper<int>(2000);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_248);
  local_248[0x2a] = true;
  index = 1;
  local_248._60_4_ = iVar4;
  do {
    iVar4 = UniqueObjectHelper<int>(index);
    local_2e8._0_4_ = iVar4;
    google::
    sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert(&local_1b8,
             (sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_248,(value_type *)local_2e8);
    index = index + 1;
  } while (index != 100);
  local_1b8.first.ht._0_4_ = UniqueObjectHelper<int>(0x38);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_248,(key_type *)&local_1b8);
  local_1b8.first.ht._0_4_ = UniqueObjectHelper<int>(0x16);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_248,(key_type *)&local_1b8);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_248);
  bVar3 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          serialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                    ((sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)(local_248 + 0x48));
  local_338.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_338.ht._1_7_,bVar3);
  local_338.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e8,(internal *)&local_338,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &string_buffer)","false"
               ,"true",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x527,(char *)local_2e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if ((char *)local_2e8._0_8_ != local_2d8) {
      operator_delete((void *)local_2e8._0_8_);
    }
    if (local_358 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_358 + 8))();
    }
  }
  cVar2._M_current = local_338.pos.row_begin._M_current;
  if (local_338.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_338.pos.row_begin._M_current)->group !=
        &((local_338.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_338.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar2._M_current);
  }
  local_358 = (undefined1  [8])0x0;
  local_350 = (undefined8 *)((ulong)local_350._4_4_ << 0x20);
  local_368.super_Hasher._0_8_ = (long *)0x0;
  local_368.super_Hasher.num_compares_ = 0;
  local_338.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_338.ht & 0xffffffff00000000);
  local_338.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  this_00 = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_2e8 + 8);
  local_2e8._0_8_ = &PTR__BaseHashtableInterface_00c23ca8;
  pSVar6 = &local_339;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(TransparentHasher *)local_358,&local_368,(Identity *)&local_348,
                     pSVar6,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_338);
  local_2e8._0_8_ = &PTR__BaseHashtableInterface_00c23c28;
  local_2a0 = 0;
  bVar3 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          unserialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                    (local_298,&local_1b8);
  local_2c0 = local_2c0 * (float)local_260;
  local_2d8._8_8_ = (undefined8)local_2c0;
  local_2d8._8_8_ =
       (long)(local_2c0 - 9.223372e+18) & (long)local_2d8._8_8_ >> 0x3f | local_2d8._8_8_;
  local_2bc = (float)local_260 * local_2bc;
  local_2c8 = (ulong)local_2bc;
  local_2c8 = (long)(local_2bc - 9.223372e+18) & (long)local_2c8 >> 0x3f | local_2c8;
  local_2b8 = 0;
  local_358[0] = (Identity)bVar3;
  local_350 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)
               "ht_in.unserialize(typename TypeParam::NopointerSerializer(), &string_buffer)",
               "false","true",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52b,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((long *)local_368.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_368.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_368.super_Hasher.id_ = iVar4;
  local_348.data_._0_4_ = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_338,this_00,(int *)&local_348);
  local_2f0 = (value_type *)local_2e8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_358,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (int *)&local_368,local_338.pos.col_current);
  if (local_358[0] == (Identity)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_350 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_350;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_338.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(99);
  local_368.super_Hasher.id_ = iVar4;
  local_348.data_._0_4_ = UniqueObjectHelper<int>(99);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_338,this_00,(int *)&local_348);
  local_2f0 = (value_type *)local_2e8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_358,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (int *)&local_368,local_338.pos.col_current);
  if (local_358[0] == (Identity)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_350 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_350;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_338.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(100);
  local_338.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_338.ht._4_4_,iVar4);
  pVar7 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_00,(int *)&local_338);
  bVar3 = pVar7.first == 0xffffffffffffffff;
  local_358[0] = (Identity)bVar3;
  local_350 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)pSVar6)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52f,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((long *)local_368.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_368.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x15);
  local_368.super_Hasher.id_ = iVar4;
  local_348.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_338,this_00,(int *)&local_348);
  local_2f0 = (value_type *)local_2e8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_358,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (int *)&local_368,local_338.pos.col_current);
  if (local_358[0] == (Identity)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_350 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_350;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x530,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_338.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_338.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_338.ht._4_4_,iVar4);
  pVar7 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_00,(int *)&local_338);
  bVar3 = pVar7.first == 0xffffffffffffffff;
  local_358[0] = (Identity)bVar3;
  local_350 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x532,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((long *)local_368.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_368.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_338.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_338.ht._4_4_,iVar4);
  pVar7 = google::
          sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_00,(int *)&local_338);
  bVar3 = pVar7.first == 0xffffffffffffffff;
  local_358[0] = (Identity)bVar3;
  local_350 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x533,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((long *)local_368.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_368.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  local_2e8._0_8_ = &PTR__BaseHashtableInterface_00c23ca8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_298);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  local_250 = &PTR__BaseHashtableInterface_00c23ca8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_248 + 0x48));
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}